

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> *node)

{
  pointer pNVar1;
  unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> *in_RDX;
  unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_> local_30;
  unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_> local_28 [2];
  unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pNVar1 = std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::unique_ptr
            (&local_30,&pNVar1->value);
  (*(code *)(node->_M_t).
            super___uniq_ptr_impl<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>.
            _M_t.
            super__Tuple_impl<0UL,_verilogAST::NegEdge_*,_std::default_delete<verilogAST::NegEdge>_>
            .super__Head_base<0UL,_verilogAST::NegEdge_*,_false>._M_head_impl[1].super_Node.
            _vptr_Node)(local_28,node,&local_30);
  pNVar1 = std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::operator=
            (&pNVar1->value,local_28);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>::unique_ptr
            ((unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> *)this,
             in_RDX);
  return (__uniq_ptr_data<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>,_true,_true>
         )(__uniq_ptr_data<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<NegEdge> Transformer::visit(std::unique_ptr<NegEdge> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}